

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::utp_stream::
async_write_some<boost::asio::const_buffers_1,boost::asio::detail::write_op<libtorrent::aux::socket_type,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
          (utp_stream *this,const_buffers_1 *buffers,
          write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
          *handler)

{
  io_context *piVar1;
  size_t len;
  initiate_post local_7c [3];
  initiate_post local_79;
  _Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::system::error_code,_unsigned_long)>
  local_78;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_78._M_f.stream_ = handler->stream_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.data_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.size_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.
    total_consumed_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.
         total_consumed_;
    local_78._M_f.start_ = handler->start_;
    local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
    local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_78._M_f.handler_._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    boost::asio::io_context::initiate_post::operator()
              (local_7c,(_Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                         *)&local_78,piVar1);
  }
  else if ((this->m_write_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    len = (buffers->super_const_buffer).size_;
    if (len != 0) {
      add_write_buffer(this,(buffers->super_const_buffer).data_,len);
      if ((buffers->super_const_buffer).size_ != 0) {
        std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_write_handler,handler);
        issue_write(this);
        return;
      }
    }
    piVar1 = this->m_io_service;
    local_78._M_f.stream_ = handler->stream_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.data_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.size_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.
    total_consumed_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.
         total_consumed_;
    local_78._M_f.start_ = handler->start_;
    local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
    local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_78._M_f.handler_._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl._5_1_ = local_7c[0];
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl._6_1_ = local_7c[1];
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl._7_1_ = local_7c[2];
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    boost::asio::io_context::initiate_post::operator()(&local_79,&local_78,piVar1);
  }
  else {
    piVar1 = this->m_io_service;
    local_78._M_f.stream_ = handler->stream_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.data_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.data_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
    super_const_buffer.size_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.buffer_.
         super_const_buffer.size_;
    local_78._M_f.buffers_.super_consuming_single_buffer<boost::asio::const_buffers_1>.
    total_consumed_ =
         (handler->buffers_).super_consuming_single_buffer<boost::asio::const_buffers_1>.
         total_consumed_;
    local_78._M_f.start_ = handler->start_;
    local_78._M_f.handler_._M_f = (handler->handler_)._M_f;
    local_78._M_f.handler_._8_8_ = *(undefined8 *)&(handler->handler_).field_0x8;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_f.handler_._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (handler->handler_)._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_78._M_f.handler_._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_f.handler_._M_bound_args.
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
         super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_78._M_f.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_78._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    boost::asio::io_context::initiate_post::operator()
              (local_7c,(_Bind_result<void,_boost::asio::detail::write_op<libtorrent::aux::socket_type,_boost::asio::mutable_buffers_1,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_std::_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>_(boost::asio::error::basic_errors,_unsigned_long)>
                         *)&local_78,piVar1);
  }
  if (local_78._M_f.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._M_f.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>_>
               .super__Head_base<0UL,_std::shared_ptr<libtorrent::http_connection>,_false>.
               _M_head_impl.
               super___shared_ptr<libtorrent::http_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler const& handler)
	{
		if (m_impl == nullptr)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			m_io_service.post(std::bind<void>(handler
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
#if BOOST_VERSION >= 106600
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
#else
		for (typename Const_Buffers::const_iterator i = buffers.begin()
			, end(buffers.end()); i != end; ++i)
#endif
		{
			if (buffer_size(*i) == 0) continue;
			using boost::asio::buffer_cast;
			using boost::asio::buffer_size;
			add_write_buffer(buffer_cast<void const*>(*i), buffer_size(*i));
			bytes_added += buffer_size(*i);
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			m_io_service.post(std::bind<void>(handler, error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = handler;
		issue_write();
	}